

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::sse42::VirtualCurveIntersectorK<4>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  char cVar18;
  AABBNodeMB4D *node1;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  undefined4 uVar24;
  ulong unaff_RBP;
  undefined4 uVar25;
  ulong uVar26;
  size_t sVar27;
  NodeRef *pNVar28;
  NodeRef *pNVar29;
  ulong uVar30;
  ulong uVar31;
  float fVar39;
  float fVar40;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar41;
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 ai_3;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar59;
  float fVar60;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  vint4 ai;
  float fVar70;
  undefined1 auVar71 [16];
  float fVar72;
  vint4 bi;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  vint4 ai_1;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar8 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar9 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar10 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar64 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar70 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar72 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar74 = fVar64 * 0.99999964;
  fVar83 = fVar70 * 0.99999964;
  fVar73 = fVar72 * 0.99999964;
  fVar64 = fVar64 * 1.0000004;
  fVar70 = fVar70 * 1.0000004;
  fVar72 = fVar72 * 1.0000004;
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar11 = (tray->tnear).field_0.i[k];
  iVar12 = (tray->tfar).field_0.i[k];
  pNVar29 = stack + 1;
  do {
    pNVar28 = pNVar29;
    if (pNVar28 == stack) break;
    pNVar29 = pNVar28 + -1;
    sVar27 = pNVar28[-1].ptr;
    do {
      if ((sVar27 & 8) == 0) {
        fVar13 = *(float *)(ray + k * 4 + 0x70);
        uVar21 = (uint)sVar27 & 7;
        uVar19 = sVar27 & 0xfffffffffffffff0;
        uVar25 = (undefined4)(unaff_RBP >> 0x20);
        if (uVar21 == 3) {
          fVar65 = 1.0 - fVar13;
          fVar66 = fVar65 * 0.0;
          auVar57._0_4_ =
               fVar8 * *(float *)(uVar19 + 0x20) +
               fVar9 * *(float *)(uVar19 + 0x50) + fVar10 * *(float *)(uVar19 + 0x80);
          auVar57._4_4_ =
               fVar8 * *(float *)(uVar19 + 0x24) +
               fVar9 * *(float *)(uVar19 + 0x54) + fVar10 * *(float *)(uVar19 + 0x84);
          auVar57._8_4_ =
               fVar8 * *(float *)(uVar19 + 0x28) +
               fVar9 * *(float *)(uVar19 + 0x58) + fVar10 * *(float *)(uVar19 + 0x88);
          auVar57._12_4_ =
               fVar8 * *(float *)(uVar19 + 0x2c) +
               fVar9 * *(float *)(uVar19 + 0x5c) + fVar10 * *(float *)(uVar19 + 0x8c);
          auVar47._0_4_ =
               fVar8 * *(float *)(uVar19 + 0x30) +
               fVar9 * *(float *)(uVar19 + 0x60) + fVar10 * *(float *)(uVar19 + 0x90);
          auVar47._4_4_ =
               fVar8 * *(float *)(uVar19 + 0x34) +
               fVar9 * *(float *)(uVar19 + 100) + fVar10 * *(float *)(uVar19 + 0x94);
          auVar47._8_4_ =
               fVar8 * *(float *)(uVar19 + 0x38) +
               fVar9 * *(float *)(uVar19 + 0x68) + fVar10 * *(float *)(uVar19 + 0x98);
          auVar47._12_4_ =
               fVar8 * *(float *)(uVar19 + 0x3c) +
               fVar9 * *(float *)(uVar19 + 0x6c) + fVar10 * *(float *)(uVar19 + 0x9c);
          auVar55._0_4_ =
               fVar8 * *(float *)(uVar19 + 0x40) +
               fVar9 * *(float *)(uVar19 + 0x70) + fVar10 * *(float *)(uVar19 + 0xa0);
          auVar55._4_4_ =
               fVar8 * *(float *)(uVar19 + 0x44) +
               fVar9 * *(float *)(uVar19 + 0x74) + fVar10 * *(float *)(uVar19 + 0xa4);
          auVar55._8_4_ =
               fVar8 * *(float *)(uVar19 + 0x48) +
               fVar9 * *(float *)(uVar19 + 0x78) + fVar10 * *(float *)(uVar19 + 0xa8);
          auVar55._12_4_ =
               fVar8 * *(float *)(uVar19 + 0x4c) +
               fVar9 * *(float *)(uVar19 + 0x7c) + fVar10 * *(float *)(uVar19 + 0xac);
          fVar79 = (float)DAT_01ff1d40;
          fVar80 = DAT_01ff1d40._4_4_;
          fVar81 = DAT_01ff1d40._8_4_;
          fVar82 = DAT_01ff1d40._12_4_;
          auVar58._4_4_ = -(uint)(ABS(auVar57._4_4_) < fVar80);
          auVar58._0_4_ = -(uint)(ABS(auVar57._0_4_) < fVar79);
          auVar58._8_4_ = -(uint)(ABS(auVar57._8_4_) < fVar81);
          auVar58._12_4_ = -(uint)(ABS(auVar57._12_4_) < fVar82);
          auVar58 = blendvps(auVar57,_DAT_01ff1d40,auVar58);
          auVar36._4_4_ = -(uint)(ABS(auVar47._4_4_) < fVar80);
          auVar36._0_4_ = -(uint)(ABS(auVar47._0_4_) < fVar79);
          auVar36._8_4_ = -(uint)(ABS(auVar47._8_4_) < fVar81);
          auVar36._12_4_ = -(uint)(ABS(auVar47._12_4_) < fVar82);
          auVar52 = blendvps(auVar47,_DAT_01ff1d40,auVar36);
          auVar37._4_4_ = -(uint)(ABS(auVar55._4_4_) < fVar80);
          auVar37._0_4_ = -(uint)(ABS(auVar55._0_4_) < fVar79);
          auVar37._8_4_ = -(uint)(ABS(auVar55._8_4_) < fVar81);
          auVar37._12_4_ = -(uint)(ABS(auVar55._12_4_) < fVar82);
          auVar54 = blendvps(auVar55,_DAT_01ff1d40,auVar37);
          auVar34 = rcpps(auVar37,auVar58);
          fVar79 = auVar34._0_4_;
          fVar82 = auVar34._4_4_;
          fVar62 = auVar34._8_4_;
          fVar63 = auVar34._12_4_;
          fVar79 = (1.0 - auVar58._0_4_ * fVar79) * fVar79 + fVar79;
          fVar82 = (1.0 - auVar58._4_4_ * fVar82) * fVar82 + fVar82;
          fVar62 = (1.0 - auVar58._8_4_ * fVar62) * fVar62 + fVar62;
          fVar63 = (1.0 - auVar58._12_4_ * fVar63) * fVar63 + fVar63;
          auVar34 = rcpps(auVar34,auVar52);
          fVar80 = auVar34._0_4_;
          auVar48._0_4_ = auVar52._0_4_ * fVar80;
          fVar59 = auVar34._4_4_;
          auVar48._4_4_ = auVar52._4_4_ * fVar59;
          fVar60 = auVar34._8_4_;
          auVar48._8_4_ = auVar52._8_4_ * fVar60;
          fVar61 = auVar34._12_4_;
          auVar48._12_4_ = auVar52._12_4_ * fVar61;
          fVar80 = (1.0 - auVar48._0_4_) * fVar80 + fVar80;
          fVar59 = (1.0 - auVar48._4_4_) * fVar59 + fVar59;
          fVar60 = (1.0 - auVar48._8_4_) * fVar60 + fVar60;
          fVar61 = (1.0 - auVar48._12_4_) * fVar61 + fVar61;
          auVar34 = rcpps(auVar48,auVar54);
          fVar81 = auVar34._0_4_;
          fVar39 = auVar34._4_4_;
          fVar40 = auVar34._8_4_;
          fVar41 = auVar34._12_4_;
          fVar81 = (1.0 - auVar54._0_4_ * fVar81) * fVar81 + fVar81;
          fVar39 = (1.0 - auVar54._4_4_ * fVar39) * fVar39 + fVar39;
          fVar40 = (1.0 - auVar54._8_4_ * fVar40) * fVar40 + fVar40;
          fVar41 = (1.0 - auVar54._12_4_ * fVar41) * fVar41 + fVar41;
          fVar84 = *(float *)(uVar19 + 0x20) * fVar5 +
                   *(float *)(uVar19 + 0x50) * fVar6 +
                   *(float *)(uVar19 + 0x80) * fVar7 + *(float *)(uVar19 + 0xb0);
          fVar85 = *(float *)(uVar19 + 0x24) * fVar5 +
                   *(float *)(uVar19 + 0x54) * fVar6 +
                   *(float *)(uVar19 + 0x84) * fVar7 + *(float *)(uVar19 + 0xb4);
          fVar86 = *(float *)(uVar19 + 0x28) * fVar5 +
                   *(float *)(uVar19 + 0x58) * fVar6 +
                   *(float *)(uVar19 + 0x88) * fVar7 + *(float *)(uVar19 + 0xb8);
          fVar87 = *(float *)(uVar19 + 0x2c) * fVar5 +
                   *(float *)(uVar19 + 0x5c) * fVar6 +
                   *(float *)(uVar19 + 0x8c) * fVar7 + *(float *)(uVar19 + 0xbc);
          fVar88 = *(float *)(uVar19 + 0x30) * fVar5 +
                   *(float *)(uVar19 + 0x60) * fVar6 +
                   *(float *)(uVar19 + 0x90) * fVar7 + *(float *)(uVar19 + 0xc0);
          fVar89 = *(float *)(uVar19 + 0x34) * fVar5 +
                   *(float *)(uVar19 + 100) * fVar6 +
                   *(float *)(uVar19 + 0x94) * fVar7 + *(float *)(uVar19 + 0xc4);
          fVar90 = *(float *)(uVar19 + 0x38) * fVar5 +
                   *(float *)(uVar19 + 0x68) * fVar6 +
                   *(float *)(uVar19 + 0x98) * fVar7 + *(float *)(uVar19 + 200);
          fVar91 = *(float *)(uVar19 + 0x3c) * fVar5 +
                   *(float *)(uVar19 + 0x6c) * fVar6 +
                   *(float *)(uVar19 + 0x9c) * fVar7 + *(float *)(uVar19 + 0xcc);
          fVar92 = *(float *)(uVar19 + 0x40) * fVar5 +
                   *(float *)(uVar19 + 0x70) * fVar6 +
                   *(float *)(uVar19 + 0xa0) * fVar7 + *(float *)(uVar19 + 0xd0);
          fVar93 = *(float *)(uVar19 + 0x44) * fVar5 +
                   *(float *)(uVar19 + 0x74) * fVar6 +
                   *(float *)(uVar19 + 0xa4) * fVar7 + *(float *)(uVar19 + 0xd4);
          fVar94 = *(float *)(uVar19 + 0x48) * fVar5 +
                   *(float *)(uVar19 + 0x78) * fVar6 +
                   *(float *)(uVar19 + 0xa8) * fVar7 + *(float *)(uVar19 + 0xd8);
          fVar95 = *(float *)(uVar19 + 0x4c) * fVar5 +
                   *(float *)(uVar19 + 0x7c) * fVar6 +
                   *(float *)(uVar19 + 0xac) * fVar7 + *(float *)(uVar19 + 0xdc);
          auVar54._4_4_ = iVar11;
          auVar54._0_4_ = iVar11;
          auVar54._8_4_ = iVar11;
          auVar54._12_4_ = iVar11;
          auVar52._4_4_ = iVar12;
          auVar52._0_4_ = iVar12;
          auVar52._8_4_ = iVar12;
          auVar52._12_4_ = iVar12;
          fVar75 = ((*(float *)(uVar19 + 0xe0) * fVar13 + fVar66) - fVar84) * fVar79;
          fVar76 = ((*(float *)(uVar19 + 0xe4) * fVar13 + fVar66) - fVar85) * fVar82;
          fVar77 = ((*(float *)(uVar19 + 0xe8) * fVar13 + fVar66) - fVar86) * fVar62;
          fVar78 = ((*(float *)(uVar19 + 0xec) * fVar13 + fVar66) - fVar87) * fVar63;
          fVar79 = ((*(float *)(uVar19 + 0x110) * fVar13 + fVar65) - fVar84) * fVar79;
          fVar82 = ((*(float *)(uVar19 + 0x114) * fVar13 + fVar65) - fVar85) * fVar82;
          fVar62 = ((*(float *)(uVar19 + 0x118) * fVar13 + fVar65) - fVar86) * fVar62;
          fVar63 = ((*(float *)(uVar19 + 0x11c) * fVar13 + fVar65) - fVar87) * fVar63;
          fVar84 = ((*(float *)(uVar19 + 0xf0) * fVar13 + fVar66) - fVar88) * fVar80;
          fVar85 = ((*(float *)(uVar19 + 0xf4) * fVar13 + fVar66) - fVar89) * fVar59;
          fVar86 = ((*(float *)(uVar19 + 0xf8) * fVar13 + fVar66) - fVar90) * fVar60;
          fVar87 = ((*(float *)(uVar19 + 0xfc) * fVar13 + fVar66) - fVar91) * fVar61;
          fVar67 = ((fVar66 + *(float *)(uVar19 + 0x100) * fVar13) - fVar92) * fVar81;
          fVar68 = ((fVar66 + *(float *)(uVar19 + 0x104) * fVar13) - fVar93) * fVar39;
          fVar69 = ((fVar66 + *(float *)(uVar19 + 0x108) * fVar13) - fVar94) * fVar40;
          fVar66 = ((fVar66 + *(float *)(uVar19 + 0x10c) * fVar13) - fVar95) * fVar41;
          fVar80 = ((*(float *)(uVar19 + 0x120) * fVar13 + fVar65) - fVar88) * fVar80;
          fVar59 = ((*(float *)(uVar19 + 0x124) * fVar13 + fVar65) - fVar89) * fVar59;
          fVar60 = ((*(float *)(uVar19 + 0x128) * fVar13 + fVar65) - fVar90) * fVar60;
          fVar61 = ((*(float *)(uVar19 + 300) * fVar13 + fVar65) - fVar91) * fVar61;
          fVar81 = ((fVar13 * *(float *)(uVar19 + 0x130) + fVar65) - fVar92) * fVar81;
          fVar39 = ((fVar13 * *(float *)(uVar19 + 0x134) + fVar65) - fVar93) * fVar39;
          fVar40 = ((fVar13 * *(float *)(uVar19 + 0x138) + fVar65) - fVar94) * fVar40;
          fVar41 = ((fVar13 * *(float *)(uVar19 + 0x13c) + fVar65) - fVar95) * fVar41;
          auVar38._0_4_ =
               (uint)((int)fVar80 < (int)fVar84) * (int)fVar80 |
               (uint)((int)fVar80 >= (int)fVar84) * (int)fVar84;
          auVar38._4_4_ =
               (uint)((int)fVar59 < (int)fVar85) * (int)fVar59 |
               (uint)((int)fVar59 >= (int)fVar85) * (int)fVar85;
          auVar38._8_4_ =
               (uint)((int)fVar60 < (int)fVar86) * (int)fVar60 |
               (uint)((int)fVar60 >= (int)fVar86) * (int)fVar86;
          auVar38._12_4_ =
               (uint)((int)fVar61 < (int)fVar87) * (int)fVar61 |
               (uint)((int)fVar61 >= (int)fVar87) * (int)fVar87;
          auVar49._0_4_ =
               (uint)((int)fVar81 < (int)fVar67) * (int)fVar81 |
               (uint)((int)fVar81 >= (int)fVar67) * (int)fVar67;
          auVar49._4_4_ =
               (uint)((int)fVar39 < (int)fVar68) * (int)fVar39 |
               (uint)((int)fVar39 >= (int)fVar68) * (int)fVar68;
          auVar49._8_4_ =
               (uint)((int)fVar40 < (int)fVar69) * (int)fVar40 |
               (uint)((int)fVar40 >= (int)fVar69) * (int)fVar69;
          auVar49._12_4_ =
               (uint)((int)fVar41 < (int)fVar66) * (int)fVar41 |
               (uint)((int)fVar41 >= (int)fVar66) * (int)fVar66;
          auVar34 = maxps(auVar38,auVar49);
          auVar50._0_4_ =
               (uint)((int)fVar79 < (int)fVar75) * (int)fVar79 |
               (uint)((int)fVar79 >= (int)fVar75) * (int)fVar75;
          auVar50._4_4_ =
               (uint)((int)fVar82 < (int)fVar76) * (int)fVar82 |
               (uint)((int)fVar82 >= (int)fVar76) * (int)fVar76;
          auVar50._8_4_ =
               (uint)((int)fVar62 < (int)fVar77) * (int)fVar62 |
               (uint)((int)fVar62 >= (int)fVar77) * (int)fVar77;
          auVar50._12_4_ =
               (uint)((int)fVar63 < (int)fVar78) * (int)fVar63 |
               (uint)((int)fVar63 >= (int)fVar78) * (int)fVar78;
          auVar71._0_4_ =
               (uint)((int)fVar80 < (int)fVar84) * (int)fVar84 |
               (uint)((int)fVar80 >= (int)fVar84) * (int)fVar80;
          auVar71._4_4_ =
               (uint)((int)fVar59 < (int)fVar85) * (int)fVar85 |
               (uint)((int)fVar59 >= (int)fVar85) * (int)fVar59;
          auVar71._8_4_ =
               (uint)((int)fVar60 < (int)fVar86) * (int)fVar86 |
               (uint)((int)fVar60 >= (int)fVar86) * (int)fVar60;
          auVar71._12_4_ =
               (uint)((int)fVar61 < (int)fVar87) * (int)fVar87 |
               (uint)((int)fVar61 >= (int)fVar87) * (int)fVar61;
          auVar42._0_4_ =
               (uint)((int)fVar81 < (int)fVar67) * (int)fVar67 |
               (uint)((int)fVar81 >= (int)fVar67) * (int)fVar81;
          auVar42._4_4_ =
               (uint)((int)fVar39 < (int)fVar68) * (int)fVar68 |
               (uint)((int)fVar39 >= (int)fVar68) * (int)fVar39;
          auVar42._8_4_ =
               (uint)((int)fVar40 < (int)fVar69) * (int)fVar69 |
               (uint)((int)fVar40 >= (int)fVar69) * (int)fVar40;
          auVar42._12_4_ =
               (uint)((int)fVar41 < (int)fVar66) * (int)fVar66 |
               (uint)((int)fVar41 >= (int)fVar66) * (int)fVar41;
          auVar58 = minps(auVar71,auVar42);
          auVar54 = maxps(auVar54,auVar50);
          auVar54 = maxps(auVar54,auVar34);
          auVar34._4_4_ =
               (uint)((int)fVar82 < (int)fVar76) * (int)fVar76 |
               (uint)((int)fVar82 >= (int)fVar76) * (int)fVar82;
          auVar34._0_4_ =
               (uint)((int)fVar79 < (int)fVar75) * (int)fVar75 |
               (uint)((int)fVar79 >= (int)fVar75) * (int)fVar79;
          auVar34._8_4_ =
               (uint)((int)fVar62 < (int)fVar77) * (int)fVar77 |
               (uint)((int)fVar62 >= (int)fVar77) * (int)fVar62;
          auVar34._12_4_ =
               (uint)((int)fVar63 < (int)fVar78) * (int)fVar78 |
               (uint)((int)fVar63 >= (int)fVar78) * (int)fVar63;
          auVar34 = minps(auVar52,auVar34);
          auVar34 = minps(auVar34,auVar58);
          auVar43._4_4_ = -(uint)(auVar54._4_4_ * 0.99999964 <= auVar34._4_4_ * 1.0000004);
          auVar43._0_4_ = -(uint)(auVar54._0_4_ * 0.99999964 <= auVar34._0_4_ * 1.0000004);
          auVar43._8_4_ = -(uint)(auVar54._8_4_ * 0.99999964 <= auVar34._8_4_ * 1.0000004);
          auVar43._12_4_ = -(uint)(auVar54._12_4_ * 0.99999964 <= auVar34._12_4_ * 1.0000004);
          uVar24 = movmskps((int)unaff_RBP,auVar43);
          unaff_RBP = CONCAT44(uVar25,uVar24);
        }
        else {
          pfVar3 = (float *)(uVar19 + 0x80 + uVar30);
          pfVar1 = (float *)(uVar19 + 0x20 + uVar30);
          pfVar4 = (float *)(uVar19 + 0x80 + uVar23);
          pfVar2 = (float *)(uVar19 + 0x20 + uVar23);
          auVar44._0_4_ = ((*pfVar3 * fVar13 + *pfVar1) - fVar5) * fVar74;
          auVar44._4_4_ = ((pfVar3[1] * fVar13 + pfVar1[1]) - fVar5) * fVar74;
          auVar44._8_4_ = ((pfVar3[2] * fVar13 + pfVar1[2]) - fVar5) * fVar74;
          auVar44._12_4_ = ((pfVar3[3] * fVar13 + pfVar1[3]) - fVar5) * fVar74;
          auVar51._0_4_ = ((*pfVar4 * fVar13 + *pfVar2) - fVar6) * fVar83;
          auVar51._4_4_ = ((pfVar4[1] * fVar13 + pfVar2[1]) - fVar6) * fVar83;
          auVar51._8_4_ = ((pfVar4[2] * fVar13 + pfVar2[2]) - fVar6) * fVar83;
          auVar51._12_4_ = ((pfVar4[3] * fVar13 + pfVar2[3]) - fVar6) * fVar83;
          pfVar2 = (float *)(uVar19 + 0x80 + uVar31);
          pfVar1 = (float *)(uVar19 + 0x20 + uVar31);
          auVar32._0_4_ = ((*pfVar2 * fVar13 + *pfVar1) - fVar7) * fVar73;
          auVar32._4_4_ = ((pfVar2[1] * fVar13 + pfVar1[1]) - fVar7) * fVar73;
          auVar32._8_4_ = ((pfVar2[2] * fVar13 + pfVar1[2]) - fVar7) * fVar73;
          auVar32._12_4_ = ((pfVar2[3] * fVar13 + pfVar1[3]) - fVar7) * fVar73;
          auVar52 = maxps(auVar51,auVar32);
          auVar33._4_4_ = iVar11;
          auVar33._0_4_ = iVar11;
          auVar33._8_4_ = iVar11;
          auVar33._12_4_ = iVar11;
          auVar34 = maxps(auVar33,auVar44);
          pfVar2 = (float *)(uVar19 + 0x80 + (uVar30 ^ 0x10));
          pfVar1 = (float *)(uVar19 + 0x20 + (uVar30 ^ 0x10));
          auVar34 = maxps(auVar34,auVar52);
          auVar56._0_4_ = ((*pfVar2 * fVar13 + *pfVar1) - fVar5) * fVar64;
          auVar56._4_4_ = ((pfVar2[1] * fVar13 + pfVar1[1]) - fVar5) * fVar64;
          auVar56._8_4_ = ((pfVar2[2] * fVar13 + pfVar1[2]) - fVar5) * fVar64;
          auVar56._12_4_ = ((pfVar2[3] * fVar13 + pfVar1[3]) - fVar5) * fVar64;
          pfVar3 = (float *)(uVar19 + 0x80 + (uVar23 ^ 0x10));
          pfVar1 = (float *)(uVar19 + 0x20 + (uVar23 ^ 0x10));
          pfVar4 = (float *)(uVar19 + 0x80 + (uVar31 ^ 0x10));
          pfVar2 = (float *)(uVar19 + 0x20 + (uVar31 ^ 0x10));
          auVar53._0_4_ = ((*pfVar3 * fVar13 + *pfVar1) - fVar6) * fVar70;
          auVar53._4_4_ = ((pfVar3[1] * fVar13 + pfVar1[1]) - fVar6) * fVar70;
          auVar53._8_4_ = ((pfVar3[2] * fVar13 + pfVar1[2]) - fVar6) * fVar70;
          auVar53._12_4_ = ((pfVar3[3] * fVar13 + pfVar1[3]) - fVar6) * fVar70;
          auVar45._0_4_ = ((*pfVar4 * fVar13 + *pfVar2) - fVar7) * fVar72;
          auVar45._4_4_ = ((pfVar4[1] * fVar13 + pfVar2[1]) - fVar7) * fVar72;
          auVar45._8_4_ = ((pfVar4[2] * fVar13 + pfVar2[2]) - fVar7) * fVar72;
          auVar45._12_4_ = ((pfVar4[3] * fVar13 + pfVar2[3]) - fVar7) * fVar72;
          auVar54 = minps(auVar53,auVar45);
          auVar46._4_4_ = iVar12;
          auVar46._0_4_ = iVar12;
          auVar46._8_4_ = iVar12;
          auVar46._12_4_ = iVar12;
          auVar52 = minps(auVar46,auVar56);
          auVar52 = minps(auVar52,auVar54);
          bVar14 = auVar34._0_4_ <= auVar52._0_4_;
          bVar15 = auVar34._4_4_ <= auVar52._4_4_;
          bVar16 = auVar34._8_4_ <= auVar52._8_4_;
          bVar17 = auVar34._12_4_ <= auVar52._12_4_;
          if (uVar21 == 6) {
            bVar14 = (fVar13 < *(float *)(uVar19 + 0xf0) && *(float *)(uVar19 + 0xe0) <= fVar13) &&
                     bVar14;
            bVar15 = (fVar13 < *(float *)(uVar19 + 0xf4) && *(float *)(uVar19 + 0xe4) <= fVar13) &&
                     bVar15;
            bVar16 = (fVar13 < *(float *)(uVar19 + 0xf8) && *(float *)(uVar19 + 0xe8) <= fVar13) &&
                     bVar16;
            bVar17 = (fVar13 < *(float *)(uVar19 + 0xfc) && *(float *)(uVar19 + 0xec) <= fVar13) &&
                     bVar17;
          }
          auVar35._0_4_ = (uint)bVar14 * -0x80000000;
          auVar35._4_4_ = (uint)bVar15 * -0x80000000;
          auVar35._8_4_ = (uint)bVar16 * -0x80000000;
          auVar35._12_4_ = (uint)bVar17 * -0x80000000;
          uVar24 = movmskps((int)unaff_RBP,auVar35);
          unaff_RBP = CONCAT44(uVar25,uVar24);
        }
      }
      if ((sVar27 & 8) == 0) {
        if (unaff_RBP == 0) {
          uVar21 = 4;
        }
        else {
          uVar19 = sVar27 & 0xfffffffffffffff0;
          lVar22 = 0;
          if (unaff_RBP != 0) {
            for (; (unaff_RBP >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
            }
          }
          uVar21 = 0;
          sVar27 = *(size_t *)(uVar19 + lVar22 * 8);
          uVar26 = unaff_RBP - 1 & unaff_RBP;
          if (uVar26 != 0) {
            pNVar29->ptr = sVar27;
            lVar22 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
              }
            }
            uVar20 = uVar26 - 1;
            while( true ) {
              pNVar29 = pNVar29 + 1;
              sVar27 = *(size_t *)(uVar19 + lVar22 * 8);
              uVar20 = uVar20 & uVar26;
              if (uVar20 == 0) break;
              pNVar29->ptr = sVar27;
              lVar22 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                }
              }
              uVar26 = uVar20 - 1;
            }
          }
        }
      }
      else {
        uVar21 = 6;
      }
    } while (uVar21 == 0);
    if (uVar21 == 6) {
      cVar18 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(sVar27 & 0xfffffffffffffff0) * 0x40 + 0x18))(pre,ray,k);
      uVar21 = 0;
      if (cVar18 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar21 = 1;
      }
    }
  } while ((uVar21 & 3) == 0);
  return pNVar28 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }